

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManPrintStatsClasses(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  
  iVar1 = p->nObjs;
  uVar5 = 0;
  uVar6 = 0;
  iVar4 = 0;
  if (1 < (long)iVar1) {
    iVar4 = 0;
    lVar8 = 1;
    uVar6 = 0;
    uVar5 = 0;
    do {
      uVar9 = (uint)p->pReprs[lVar8] & 0xfffffff;
      if ((uVar9 == 0xfffffff) && (0 < p->pNexts[lVar8])) {
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      else if (uVar9 == 0) {
        uVar6 = (ulong)((int)uVar6 + 1);
      }
      else {
        uVar7 = 0;
        if (uVar9 == 0xfffffff) {
          uVar7 = (uint)(p->pNexts[lVar8] == 0);
        }
        iVar4 = iVar4 + uVar7;
      }
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
  }
  iVar2 = p->vCos->nSize;
  iVar3 = p->vCis->nSize;
  Abc_Print(1,"cst =%3d  cls =%6d  lit =%8d\n",uVar6,uVar5,
            (ulong)(uint)((iVar1 - (iVar4 + (int)uVar5)) + iVar2 + iVar3 + ~(iVar3 + iVar2)));
  return;
}

Assistant:

void Gia_ManPrintStatsClasses( Gia_Man_t * p )
{
    int i, Counter = 0, Counter0 = 0, CounterX = 0, Proved = 0, nLits;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
    {
        if ( Gia_ObjIsHead(p, i) )
            Counter++;
        else if ( Gia_ObjIsConst(p, i) )
            Counter0++;
        else if ( Gia_ObjIsNone(p, i) )
            CounterX++;
        if ( Gia_ObjProved(p, i) )
            Proved++;
    }
    CounterX -= Gia_ManCoNum(p);
    nLits = Gia_ManCiNum(p) + Gia_ManAndNum(p) - Counter - CounterX;

//    Abc_Print( 1, "i/o/ff =%5d/%5d/%5d  ", Gia_ManPiNum(p), Gia_ManPoNum(p), Gia_ManRegNum(p) );
//    Abc_Print( 1, "and =%5d  ", Gia_ManAndNum(p) );
//    Abc_Print( 1, "lev =%3d  ", Gia_ManLevelNum(p) );
    Abc_Print( 1, "cst =%3d  cls =%6d  lit =%8d\n", Counter0, Counter, nLits );
}